

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O3

ecs_entity_t find_child_in_table(ecs_table_t *table,char *name)

{
  char *__s1;
  _Bool _Var1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  ecs_data_t *peVar5;
  ecs_entity_t eVar6;
  void *pvVar7;
  ecs_entity_t *peVar8;
  undefined8 *puVar9;
  ulong uVar10;
  
  iVar2 = ecs_type_index_of(table->type,6);
  if ((((iVar2 != -1) && (peVar5 = ecs_table_get_data(table), peVar5 != (ecs_data_t *)0x0)) &&
      (peVar5->columns != (ecs_column_t *)0x0)) &&
     (uVar3 = ecs_vector_count(peVar5->entities), uVar3 != 0)) {
    _Var1 = is_number(name);
    if (_Var1) {
      eVar6 = name_to_id(name);
      return eVar6;
    }
    pvVar7 = _ecs_vector_first(peVar5->columns[iVar2].data,0x18,0x10);
    if (0 < (int)uVar3) {
      puVar9 = (undefined8 *)((long)pvVar7 + 8);
      uVar10 = 0;
      while( true ) {
        __s1 = (char *)*puVar9;
        if ((((char *)puVar9[-1] != (char *)0x0) &&
            (iVar4 = strcmp((char *)puVar9[-1],name), iVar4 == 0)) ||
           ((__s1 != (char *)0x0 && (iVar4 = strcmp(__s1,name), iVar4 == 0)))) break;
        uVar10 = uVar10 + 1;
        puVar9 = puVar9 + 3;
        if (uVar3 == uVar10) {
          return 0;
        }
      }
      peVar8 = (ecs_entity_t *)_ecs_vector_get(peVar5->entities,8,0x10,(int32_t)uVar10);
      return *peVar8;
    }
  }
  return 0;
}

Assistant:

static
ecs_entity_t find_child_in_table(
    ecs_table_t *table,
    const char *name)
{
    /* If table doesn't have EcsName, then don't bother */
    int32_t name_index = ecs_type_index_of(table->type, ecs_typeid(EcsName));
    if (name_index == -1) {
        return 0;
    }

    ecs_data_t *data = ecs_table_get_data(table);
    if (!data || !data->columns) {
        return 0;
    }

    int32_t i, count = ecs_vector_count(data->entities);
    if (!count) {
        return 0;
    }

    if (is_number(name)) {
        return name_to_id(name);
    }

    ecs_column_t *column = &data->columns[name_index];
    EcsName *names = ecs_vector_first(column->data, EcsName);

    for (i = 0; i < count; i ++) {
        const char *cur_name = names[i].value;
        const char *cur_sym = names[i].symbol;
        if ((cur_name && !strcmp(cur_name, name)) || (cur_sym && !strcmp(cur_sym, name))) {
            return *ecs_vector_get(data->entities, ecs_entity_t, i);
        }
    }

    return 0;
}